

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDop.cpp
# Opt level: O2

void NBvh3::getDistances<8u>(SVertex *vertex,float *dists)

{
  *dists = vertex->x;
  dists[1] = vertex->y;
  dists[2] = vertex->z;
  dists[3] = vertex->x + vertex->y;
  dists[4] = vertex->x + vertex->z;
  dists[5] = vertex->y + vertex->z;
  dists[6] = vertex->x - vertex->y;
  dists[7] = vertex->x - vertex->z;
  return;
}

Assistant:

inline void getDistances<8>(const SVertex& vertex, float dists[])
{
    dists[0] = vertex.x;
    dists[1] = vertex.y;
    dists[2] = vertex.z;
    dists[3] = vertex.x + vertex.y;
    dists[4] = vertex.x + vertex.z;
    dists[5] = vertex.y + vertex.z;
    dists[6] = vertex.x - vertex.y;
    dists[7] = vertex.x - vertex.z;
}